

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O2

v256 * v256_unpackhi_s16_s32(v256 a)

{
  v128 alVar1;
  undefined1 auVar2 [12];
  v256 *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar5._0_12_ = a.val[1]._0_12_;
  auVar5._12_2_ = a.val[1][0]._6_2_;
  auVar5._14_2_ = a.val[1][0]._6_2_;
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._0_10_ = a.val[1]._0_10_;
  auVar4._10_2_ = a.val[1][0]._4_2_;
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._0_8_ = a.val[1][0];
  auVar3._8_2_ = a.val[1][0]._4_2_;
  auVar2._4_8_ = auVar3._8_8_;
  auVar2._2_2_ = a.val[1][0]._2_2_;
  auVar2._0_2_ = a.val[1][0]._2_2_;
  alVar1[0]._4_2_ = a.val[1][1]._2_2_;
  alVar1[0]._0_4_ = (int)(short)a.val[1][1];
  alVar1[0]._6_2_ = a.val[1][1]._2_2_ >> 0xf;
  alVar1[1]._0_2_ = a.val[1][1]._4_2_;
  alVar1[1]._2_2_ = a.val[1][1]._4_2_ >> 0xf;
  alVar1[1]._4_2_ = a.val[1][1]._6_2_;
  alVar1[1]._6_2_ = a.val[1][1]._6_2_ >> 0xf;
  in_RDI->val[1] = alVar1;
  *(int *)in_RDI->val[0] = (int)(short)a.val[1][0];
  *(int *)((long)in_RDI->val[0] + 4) = auVar2._0_4_ >> 0x10;
  *(int *)(in_RDI->val[0] + 1) = auVar3._8_4_ >> 0x10;
  *(int *)((long)in_RDI->val[0] + 0xc) = auVar4._12_4_ >> 0x10;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_unpackhi_s16_s32(v256 a) {
  return v256_from_v128(v128_unpackhi_s16_s32(a.val[1]),
                        v128_unpacklo_s16_s32(a.val[1]));
}